

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnCallIndirectExpr(BinaryReaderIR *this,Index sig_index)

{
  value_type pFVar1;
  Index index;
  Result RVar2;
  size_type sVar3;
  pointer pCVar4;
  reference ppFVar5;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_a8 [3];
  Location local_90;
  Var local_70;
  unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_> local_28;
  unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_> expr;
  Index sig_index_local;
  BinaryReaderIR *this_local;
  
  expr._M_t.
  super___uniq_ptr_impl<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::CallIndirectExpr_*,_std::default_delete<wabt::CallIndirectExpr>_>.
  super__Head_base<0UL,_wabt::CallIndirectExpr_*,_false>._M_head_impl._4_4_ = sig_index;
  sVar3 = std::vector<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>::size
                    (&this->module_->func_types);
  if (sig_index < sVar3) {
    MakeUnique<wabt::CallIndirectExpr>();
    pCVar4 = std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>::
             operator->(&local_28);
    index = expr._M_t.
            super___uniq_ptr_impl<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>
            ._M_t.
            super__Tuple_impl<0UL,_wabt::CallIndirectExpr_*,_std::default_delete<wabt::CallIndirectExpr>_>
            .super__Head_base<0UL,_wabt::CallIndirectExpr_*,_false>._M_head_impl._4_4_;
    (pCVar4->decl).has_func_type = true;
    GetLocation(&local_90,this);
    Var::Var(&local_70,index,&local_90);
    pCVar4 = std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>::
             operator->(&local_28);
    Var::operator=(&(pCVar4->decl).type_var,&local_70);
    Var::~Var(&local_70);
    ppFVar5 = std::vector<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>::operator[]
                        (&this->module_->func_types,
                         (ulong)expr._M_t.
                                super___uniq_ptr_impl<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wabt::CallIndirectExpr_*,_std::default_delete<wabt::CallIndirectExpr>_>
                                .super__Head_base<0UL,_wabt::CallIndirectExpr_*,_false>._M_head_impl
                                ._4_4_);
    pFVar1 = *ppFVar5;
    pCVar4 = std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>::
             operator->(&local_28);
    FuncSignature::operator=(&(pCVar4->decl).sig,&pFVar1->sig);
    std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
    unique_ptr<wabt::CallIndirectExpr,std::default_delete<wabt::CallIndirectExpr>,void>
              ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)local_a8,&local_28);
    RVar2 = AppendExpr(this,local_a8);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(local_a8);
    std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>::
    ~unique_ptr(&local_28);
    return (Result)RVar2.enum_;
  }
  __assert_fail("sig_index < module_->func_types.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                ,0x29d,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnCallIndirectExpr(Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnCallIndirectExpr(Index sig_index) {
  assert(sig_index < module_->func_types.size());
  auto expr = MakeUnique<CallIndirectExpr>();
  expr->decl.has_func_type = true;
  expr->decl.type_var = Var(sig_index, GetLocation());
  expr->decl.sig = module_->func_types[sig_index]->sig;
  return AppendExpr(std::move(expr));
}